

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  bVar3 = 0 < *(int *)(desc + 0x78);
  if (0 < *(int *)(desc + 0x78)) {
    lVar5 = 0x58;
    lVar4 = 0;
    do {
      if ((*(char *)(*(long *)(desc + 0x80) + -8 + lVar5) == '\x01') &&
         (iVar2 = std::__cxx11::string::compare
                            ((char *)**(undefined8 **)
                                       (*(long *)(*(long *)(desc + 0x80) + lVar5) + 0x10)),
         iVar2 != 0)) {
        if (bVar3) {
          return true;
        }
        break;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xa8;
      bVar3 = lVar4 < *(int *)(desc + 0x78);
    } while (lVar4 < *(int *)(desc + 0x78));
  }
  bVar3 = 0 < *(int *)(desc + 0x48);
  if ((0 < *(int *)(desc + 0x48)) && (bVar1 = HasExtensions(*(Descriptor **)(desc + 0x50)), !bVar1))
  {
    lVar5 = 0;
    lVar4 = 0xa8;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < *(int *)(desc + 0x48);
      if (*(int *)(desc + 0x48) <= lVar5) {
        return bVar3;
      }
      bVar1 = HasExtensions((Descriptor *)(lVar4 + *(long *)(desc + 0x50)));
      lVar4 = lVar4 + 0xa8;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}